

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void mpt_copy64(int pts,uint64_t *src,int lds,uint64_t *dest,int ldd)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  auVar2 = _DAT_0011f070;
  if (0 < pts) {
    if (ldd == 0) {
      *dest = src[(pts + -1) * lds];
      return;
    }
    if (lds == 0) {
      uVar1 = *src;
      lVar4 = (ulong)(uint)pts - 1;
      auVar5._8_4_ = (int)lVar4;
      auVar5._0_8_ = lVar4;
      auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
      lVar4 = 0;
      auVar5 = auVar5 ^ _DAT_0011f070;
      auVar6 = _DAT_0011f060;
      do {
        auVar8 = auVar6 ^ auVar2;
        if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                    auVar5._4_4_ < auVar8._4_4_) & 1)) {
          *(uint64_t *)((long)dest + lVar4) = uVar1;
        }
        if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
            auVar8._12_4_ <= auVar5._12_4_) {
          *(uint64_t *)((long)dest + lVar4 + 8) = uVar1;
        }
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 2;
        auVar6._8_8_ = lVar7 + 2;
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(pts + 1U >> 1) << 4 != lVar4);
    }
    else if (ldd == 1 && lds == 1) {
      uVar3 = 0;
      do {
        dest[uVar3] = src[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)pts != uVar3);
    }
    else {
      do {
        *dest = *src;
        dest = dest + ldd;
        src = src + lds;
        pts = pts + -1;
      } while (pts != 0);
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}